

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oauth2.c
# Opt level: O0

CURLcode Curl_auth_create_oauth_bearer_message
                   (char *user,char *host,long port,char *bearer,bufref *out)

{
  size_t len;
  char *local_40;
  char *oauth;
  bufref *out_local;
  char *bearer_local;
  long port_local;
  char *host_local;
  char *user_local;
  
  if ((port == 0) || (port == 0x50)) {
    local_40 = curl_maprintf("n,a=%s,\x01host=%s\x01auth=Bearer %s\x01\x01",user,host,bearer);
  }
  else {
    local_40 = curl_maprintf("n,a=%s,\x01host=%s\x01port=%ld\x01auth=Bearer %s\x01\x01",user,host,
                             port,bearer);
  }
  if (local_40 == (char *)0x0) {
    user_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    len = strlen(local_40);
    Curl_bufref_set(out,local_40,len,curl_free);
    user_local._4_4_ = CURLE_OK;
  }
  return user_local._4_4_;
}

Assistant:

CURLcode Curl_auth_create_oauth_bearer_message(const char *user,
                                               const char *host,
                                               const long port,
                                               const char *bearer,
                                               struct bufref *out)
{
  char *oauth;

  /* Generate the message */
  if(port == 0 || port == 80)
    oauth = aprintf("n,a=%s,\1host=%s\1auth=Bearer %s\1\1", user, host,
                    bearer);
  else
    oauth = aprintf("n,a=%s,\1host=%s\1port=%ld\1auth=Bearer %s\1\1", user,
                    host, port, bearer);
  if(!oauth)
    return CURLE_OUT_OF_MEMORY;

  Curl_bufref_set(out, oauth, strlen(oauth), curl_free);
  return CURLE_OK;
}